

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O2

void __thiscall String::trim(String *this,int n)

{
  String local_30;
  
  if (n < 1) {
    mid(&local_30,this,(long)n,-1);
    std::__cxx11::string::_M_assign((string *)this);
  }
  else {
    mid(&local_30,this,0,(long)((int)(this->_string)._M_string_length - n));
    std::__cxx11::string::_M_assign((string *)this);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void String::trim (int n)
{
	if (n > 0)
		_string = mid (0, length() - n).stdString();
	else
		_string = mid (n, -1).stdString();
}